

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memorydata.cpp
# Opt level: O3

int __thiscall ncnn::MemoryData::load_model(MemoryData *this,ModelBin *mb)

{
  int *piVar1;
  int iVar2;
  void *pvVar3;
  void *pvVar4;
  void *local_40;
  int *local_38;
  size_t local_30;
  undefined8 local_28;
  undefined8 uStack_20;
  size_t local_18;
  
  if (this->c == 0) {
    if (this->h == 0) {
      if (this->w == 0) {
        if ((((this->data).dims != 1) || ((this->data).w != 1)) || ((this->data).elemsize != 4)) {
          piVar1 = (this->data).refcount;
          if (piVar1 != (int *)0x0) {
            LOCK();
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if ((*piVar1 == 0) && (pvVar3 = (this->data).data, pvVar3 != (void *)0x0)) {
              free(*(void **)((long)pvVar3 + -8));
            }
          }
          (this->data).elemsize = 4;
          (this->data).dims = 1;
          (this->data).w = 1;
          (this->data).h = 1;
          (this->data).c = 1;
          (this->data).cstep = 1;
          pvVar3 = malloc(0x20);
          pvVar4 = (void *)((long)pvVar3 + 0x17U & 0xfffffffffffffff0);
          *(void **)((long)pvVar4 - 8) = pvVar3;
          (this->data).data = pvVar4;
          (this->data).refcount = (int *)((long)pvVar4 + 4);
          *(undefined4 *)((long)pvVar4 + 4) = 1;
        }
        goto LAB_001103c9;
      }
      (**mb->_vptr_ModelBin)(&local_40,mb,(ulong)(uint)this->w,1);
    }
    else {
      (*mb->_vptr_ModelBin[1])(&local_40,mb,(ulong)(uint)this->w,(ulong)(uint)this->h,1);
    }
  }
  else {
    (*mb->_vptr_ModelBin[2])
              (&local_40,mb,(ulong)(uint)this->w,(ulong)(uint)this->h,(ulong)(uint)this->c,1);
  }
  if (&this->data != (Mat *)&local_40) {
    if (local_38 != (int *)0x0) {
      LOCK();
      *local_38 = *local_38 + 1;
      UNLOCK();
    }
    piVar1 = (this->data).refcount;
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if ((*piVar1 == 0) && (pvVar3 = (this->data).data, pvVar3 != (void *)0x0)) {
        free(*(void **)((long)pvVar3 + -8));
      }
    }
    (this->data).data = local_40;
    (this->data).refcount = local_38;
    (this->data).elemsize = local_30;
    (this->data).dims = (undefined4)local_28;
    (this->data).w = local_28._4_4_;
    (this->data).h = (undefined4)uStack_20;
    (this->data).c = uStack_20._4_4_;
    (this->data).cstep = local_18;
  }
  if (local_38 != (int *)0x0) {
    LOCK();
    *local_38 = *local_38 + -1;
    UNLOCK();
    if ((*local_38 == 0) && (local_40 != (void *)0x0)) {
      free(*(void **)((long)local_40 + -8));
    }
  }
LAB_001103c9:
  if (((this->data).data == (void *)0x0) ||
     (iVar2 = 0, (long)(this->data).c * (this->data).cstep == 0)) {
    iVar2 = -100;
  }
  return iVar2;
}

Assistant:

int MemoryData::load_model(const ModelBin& mb)
{
    if (c != 0)
    {
        data = mb.load(w, h, c, 1);
    }
    else if (h != 0)
    {
        data = mb.load(w, h, 1);
    }
    else if (w != 0)
    {
        data = mb.load(w, 1);
    }
    else // 0 0 0
    {
        data.create(1);
    }
    if (data.empty())
        return -100;

    return 0;
}